

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall
tinygltf::TinyGLTF::WriteGltfSceneToStream
          (TinyGLTF *this,Model *model,ostream *stream,bool prettyPrint,bool writeBinary)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  uint uVar1;
  ulong uVar2;
  allocator local_c1;
  uint local_c0;
  undefined4 local_bc;
  JsonDocument output;
  json buffer;
  json images;
  json buffers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedUris;
  json image;
  
  local_bc = (undefined4)CONCAT71(in_register_00000081,writeBinary);
  local_c0 = (uint)CONCAT71(in_register_00000009,prettyPrint);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&output,(nullptr_t)0x0);
  SerializeGltfModel(model,&output);
  usedUris.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  usedUris.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  usedUris.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&buffers,(nullptr_t)0x0);
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)(((long)(model->buffers).
                     super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl
                     .super__Vector_impl_data._M_finish -
              (long)(model->buffers).
                    super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0xf0); uVar1 = uVar1 + 1) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&buffer,(nullptr_t)0x0);
    SerializeGltfBuffer((model->buffers).
                        super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar1,&buffer);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::push_back(&buffers,&buffer);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&buffer);
  }
  anon_unknown_57::JsonAddMember(&output,"buffers",&buffers);
  if ((model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
      super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&images,(nullptr_t)0x0);
    for (uVar1 = 0; uVar2 = (ulong)uVar1,
        uVar2 < (ulong)(((long)(model->images).
                               super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(model->images).
                              super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x168); uVar1 = uVar1 + 1)
    {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&image,(nullptr_t)0x0);
      std::__cxx11::string::string((string *)&buffer,"",&local_c1);
      UpdateImageObject((model->images).
                        super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar2,(string *)&buffer,uVar1,
                        false,&this->WriteImageData,this->write_image_user_data_);
      SerializeGltfImage((model->images).
                         super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar2,&image);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::push_back(&images,&image);
      std::__cxx11::string::~string((string *)&buffer);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&image);
    }
    anon_unknown_57::JsonAddMember(&output,"images",&images);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&images);
  }
  if ((char)local_bc == '\0') {
    anon_unknown_57::JsonToString((string *)&buffer,&output,(local_c0 & 0xff) - 1 | 2);
    WriteGltfStream(stream,(string *)&buffer);
  }
  else {
    anon_unknown_57::JsonToString((string *)&buffer,&output,-1);
    WriteBinaryGltfStream(stream,(string *)&buffer);
  }
  std::__cxx11::string::~string((string *)&buffer);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&buffers);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&usedUris);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&output);
  return true;
}

Assistant:

bool TinyGLTF::WriteGltfSceneToStream(Model *model, std::ostream &stream,
                                      bool prettyPrint = true,
                                      bool writeBinary = false) {
  JsonDocument output;

  /// Serialize all properties except buffers and images.
  SerializeGltfModel(model, output);

  // BUFFERS
  std::vector<std::string> usedUris;
  json buffers;
  JsonReserveArray(buffers, model->buffers.size());
  for (unsigned int i = 0; i < model->buffers.size(); ++i) {
    json buffer;
    SerializeGltfBuffer(model->buffers[i], buffer);
    JsonPushBack(buffers, std::move(buffer));
  }
  JsonAddMember(output, "buffers", std::move(buffers));

  // IMAGES
  if (model->images.size()) {
    json images;
    JsonReserveArray(images, model->images.size());
    for (unsigned int i = 0; i < model->images.size(); ++i) {
      json image;

      std::string dummystring = "";
      // UpdateImageObject need baseDir but only uses it if embededImages is
      // enable, since we won't write separte images when writing to a stream we
      // use a dummystring
      UpdateImageObject(model->images[i], dummystring, int(i), false,
                        &this->WriteImageData, this->write_image_user_data_);
      SerializeGltfImage(model->images[i], image);
      JsonPushBack(images, std::move(image));
    }
    JsonAddMember(output, "images", std::move(images));
  }

  if (writeBinary) {
    WriteBinaryGltfStream(stream, JsonToString(output));
  } else {
    WriteGltfStream(stream, JsonToString(output, prettyPrint ? 2 : -1));
  }

  return true;
}